

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O1

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::Release
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this)

{
  INodeMap *pIVar1;
  int *piVar2;
  undefined8 *puVar3;
  gcstring local_70 [80];
  
  pIVar1 = this->_Ptr;
  if (pIVar1 != (INodeMap *)0x0) {
    piVar2 = this->_pRefCount;
    this->_pRefCount = (int *)0x0;
    this->_Ptr = (INodeMap *)0x0;
    GenICam_3_4::gcstring::gcstring(local_70,"Device");
    GenICam_3_4::gcstring::operator=(&this->_DeviceName,local_70);
    GenICam_3_4::gcstring::~gcstring(local_70);
    if ((piVar2 != (int *)0x0) && (*piVar2 = *piVar2 + -1, *piVar2 == 0)) {
      operator_delete(piVar2);
      puVar3 = (undefined8 *)GenApi_3_4::CastToIDestroy(pIVar1);
      (**(code **)*puVar3)(puVar3);
    }
  }
  return;
}

Assistant:

void GENAPI_NAMESPACE::CNodeMapRefT<TCameraParams>::Release()
    {
        if (_Ptr)
        {
            // Copy node map data for eventual later destruction
            INodeMap* pToDel = _Ptr;
            int* pRefCount = _pRefCount;

            // Clear
            _pRefCount = NULL;
            _Ptr = NULL;
            _DeviceName = "Device";

            assert(pRefCount);
            // Check if destruction is required
            if (pRefCount)
            {
                assert(*pRefCount > 0);
                --*pRefCount;
                if (*pRefCount == 0)
                {
                    // We do not need this anymore, all references are gone
                    delete pRefCount;
                    pRefCount = NULL;

                    // Destroy the node map finally
                    GENAPI_NAMESPACE::IDestroy *pDestroy = CastToIDestroy(pToDel);
                    assert(pDestroy);
                    pDestroy->Destroy(); //must not throw
                }
            }
        }
        else
        {
            // Must not have a refcount when no node map is there.
            assert(_pRefCount == NULL);
        }
    }